

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double normalcdf(double x,double mu,double sigma)

{
  double dVar1;
  double t;
  double oup;
  double sigma_local;
  double mu_local;
  double x_local;
  
  if (sigma < 0.0) {
    printf("Standard Deviation (Sigma) must be non-negative");
    exit(1);
  }
  dVar1 = sqrt(2.0);
  dVar1 = erf((x - mu) / (dVar1 * sigma));
  return (dVar1 + 1.0) * 0.5;
}

Assistant:

double normalcdf(double x, double mu, double sigma) {
	double oup,t;
	
	if (sigma < 0.) {
		printf("Standard Deviation (Sigma) must be non-negative");
		exit(1);
	}
	
	t = (x - mu ) /(sqrt(2.0) * sigma);
	
	oup = 0.5 * (1. + erf(t));
	return oup;
}